

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDir::removeRecursively(QDir *this)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  QDirPrivate *in_RDI;
  long in_FS_OFFSET;
  bool ok;
  QString *filePath;
  value_type *dirEntry;
  QDirListing *__range1;
  bool success;
  Permissions permissions;
  sentinel __end1;
  const_iterator __begin1;
  QString dirPath;
  undefined4 in_stack_fffffffffffffed8;
  IteratorFlag in_stack_fffffffffffffedc;
  QSharedDataPointer<QDirPrivate> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  byte in_stack_fffffffffffffeee;
  byte in_stack_fffffffffffffeef;
  QDirListing *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  QFlagsStorage<QFileDevice::Permission> in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  QString *in_stack_ffffffffffffff10;
  QString *path;
  QDir *this_00;
  bool local_c9;
  undefined7 in_stack_ffffffffffffff60;
  byte bVar5;
  bool local_89;
  char local_88 [24];
  QFlagsStorageHelper<QFileDevice::Permission,_4> local_70;
  Int local_6c;
  char local_60 [31];
  undefined1 local_41;
  const_iterator local_40 [2];
  QDirListing local_30;
  QDir local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedDataPointer<QDirPrivate>::operator->(in_stack_fffffffffffffee0);
  bVar1 = QDirPrivate::exists(in_RDI);
  if (bVar1) {
    bVar5 = 1;
    path = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28.d_ptr.d.ptr = (QSharedDataPointer<QDirPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = &local_28;
    QDir::path((QDir *)CONCAT17(in_stack_fffffffffffffeef,
                                CONCAT16(in_stack_fffffffffffffeee,
                                         CONCAT15(in_stack_fffffffffffffeed,
                                                  CONCAT14(in_stack_fffffffffffffeec,
                                                           in_stack_fffffffffffffee8)))));
    QFlags<QDirListing::IteratorFlag>::QFlags
              ((QFlags<QDirListing::IteratorFlag> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc);
    QDirListing::QDirListing
              ((QDirListing *)path,in_stack_ffffffffffffff10,
               (QFlagsStorageHelper<QDirListing::IteratorFlag,_4>)SUB84((ulong)this_00 >> 0x20,0));
    local_40[0].dirEntry.dirListPtr = (DirEntry)&DAT_aaaaaaaaaaaaaaaa;
    local_40[0] = QDirListing::begin(in_stack_fffffffffffffef0);
    local_41 = 0xaa;
    QDirListing::end(&local_30);
    while (bVar1 = ::operator!=(local_40), bVar1) {
      QDirListing::const_iterator::operator*(local_40);
      QDirListing::DirEntry::filePath
                ((DirEntry *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar2 = QDirListing::DirEntry::isDir((DirEntry *)0x280a77);
      if ((!(bool)uVar2) ||
         (in_stack_ffffffffffffff06 = QDirListing::DirEntry::isSymLink((DirEntry *)0x280a94),
         (bool)in_stack_ffffffffffffff06)) {
        uVar3 = QFile::remove(local_60);
        local_c9 = (bool)((byte)uVar3 & 1);
        if ((uVar3 & 1) == 0) {
          local_6c = 0xaaaaaaaa;
          in_stack_ffffffffffffff00.i =
               (Int)QFile::permissions((QString *)
                                       CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff06,
                                                               CONCAT15(in_stack_ffffffffffffff05,
                                                                        CONCAT14((byte)uVar3,
                                                                                                                                                                  
                                                  in_stack_ffffffffffffff00.i)))));
          local_6c = in_stack_ffffffffffffff00.i;
          local_70.super_QFlagsStorage<QFileDevice::Permission>.i =
               (QFlagsStorage<QFileDevice::Permission>)
               QFlags<QFileDevice::Permission>::operator&
                         ((QFlags<QFileDevice::Permission> *)in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffedc);
          bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_70);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            QFlags<QFileDevice::Permission>::operator|
                      ((QFlags<QFileDevice::Permission> *)in_stack_fffffffffffffee0,
                       in_stack_fffffffffffffedc);
            in_stack_fffffffffffffeff =
                 QFile::setPermissions
                           ((QString *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
                            ,(QFlagsStorageHelper<QFileDevice::Permission,_4>)
                             SUB84((ulong)path >> 0x20,0));
            in_stack_fffffffffffffeef = 0;
            if ((bool)in_stack_fffffffffffffeff) {
              iVar4 = QFile::remove(local_60);
              in_stack_fffffffffffffeee = (byte)iVar4;
              in_stack_fffffffffffffeef = in_stack_fffffffffffffeee;
            }
            local_c9 = (bool)(in_stack_fffffffffffffeef & 1);
          }
        }
      }
      else {
        QDir(this_00,path);
        local_c9 = removeRecursively((QDir *)CONCAT17(bVar5,in_stack_ffffffffffffff60));
        in_stack_ffffffffffffff05 = local_c9;
        ~QDir((QDir *)0x280ae6);
      }
      if (local_c9 == false) {
        bVar5 = 0;
      }
      QString::~QString((QString *)0x280c28);
      QDirListing::const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
    QDirListing::~QDirListing((QDirListing *)in_stack_fffffffffffffee0);
    if ((bVar5 & 1) != 0) {
      absolutePath((QDir *)CONCAT17(in_stack_fffffffffffffeef,
                                    CONCAT16(in_stack_fffffffffffffeee,
                                             CONCAT15(in_stack_fffffffffffffeed,
                                                      CONCAT14(in_stack_fffffffffffffeec,
                                                               in_stack_fffffffffffffee8)))));
      iVar4 = rmdir((QDir *)in_RDI,local_88);
      bVar5 = (byte)iVar4 & 1;
      QString::~QString((QString *)0x280cab);
    }
    local_89 = (bool)(bVar5 & 1);
    QString::~QString((QString *)0x280ceb);
  }
  else {
    local_89 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_89;
}

Assistant:

bool QDir::removeRecursively()
{
    if (!d_ptr->exists())
        return true;

    bool success = true;
    const QString dirPath = path();
    // not empty -- we must empty it first
    for (const auto &dirEntry : QDirListing(dirPath, QDirListing::IteratorFlag::IncludeHidden)) {
        const QString &filePath = dirEntry.filePath();
        bool ok;
        if (dirEntry.isDir() && !dirEntry.isSymLink()) {
            ok = QDir(filePath).removeRecursively(); // recursive
        } else {
            ok = QFile::remove(filePath);
            if (!ok) { // Read-only files prevent directory deletion on Windows, retry with Write permission.
                const QFile::Permissions permissions = QFile::permissions(filePath);
                if (!(permissions & QFile::WriteUser))
                    ok = QFile::setPermissions(filePath, permissions | QFile::WriteUser)
                        && QFile::remove(filePath);
            }
        }
        if (!ok)
            success = false;
    }

    if (success)
        success = rmdir(absolutePath());

    return success;
}